

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer_test.cc
# Opt level: O2

void __thiscall
writer_test_should_compute_proper_length_and_checksum_Test::
~writer_test_should_compute_proper_length_and_checksum_Test
          (writer_test_should_compute_proper_length_and_checksum_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(writer_test, should_compute_proper_length_and_checksum)
{
    Fixpp::v42::Message::Heartbeat heartbeat;
    Fixpp::set<Fixpp::Tag::TestReqID>(heartbeat, "TestReq");

    auto header = createHeader<Fixpp::v42::Header>();
    Fixpp::Writer writer;

    auto frame = writer.write(header, heartbeat);

    auto bodyLengthStartPos = frame.find("9=");
    auto bodyLengthEnd = frame.find(SOH_CHARACTER, bodyLengthStartPos);
    auto bodyLengthValueStart = bodyLengthStartPos + 2;

    auto bodyLength = frame.substr(bodyLengthValueStart, bodyLengthEnd - bodyLengthValueStart);
    auto extractedBodyLength = std::stoi(bodyLength);

    auto checksumStartPos = frame.find("10=");
    auto checksumEnd = frame.find(SOH_CHARACTER, checksumStartPos);
    auto checksumValueStart = checksumStartPos + 3;

    auto checksum = frame.substr(checksumValueStart, checksumEnd - checksumValueStart);
    auto extractedChecksum = std::stoi(checksum);

    auto expectedBodyLength = checksumStartPos - bodyLengthEnd - 1;

    size_t sum = 0;
    for (size_t i = 0; i < checksumStartPos; ++i)
    {
        sum += static_cast<size_t>(frame[i]);
    }
    
    auto expectedChecksum = sum % 256;

    ASSERT_EQ(expectedBodyLength, extractedBodyLength);
    ASSERT_EQ(expectedChecksum, extractedChecksum);
}